

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O2

JDIMENSION get_pixel_rows(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  _func_JDIMENSION_j_compress_ptr_cjpeg_source_ptr *p_Var1;
  int iVar2;
  long lVar3;
  JDIMENSION JVar4;
  JSAMPROW pJVar5;
  bool bVar6;
  
  p_Var1 = sinfo[1].get_pixel_rows;
  pJVar5 = *sinfo->buffer;
  JVar4 = cinfo->image_width;
  while (bVar6 = JVar4 != 0, JVar4 = JVar4 - 1, bVar6) {
    iVar2 = LZWReadByte((gif_source_ptr)sinfo);
    lVar3 = (long)iVar2;
    *pJVar5 = *(JSAMPLE *)(*(long *)p_Var1 + lVar3);
    pJVar5[1] = *(JSAMPLE *)(*(long *)(p_Var1 + 8) + lVar3);
    pJVar5[2] = *(JSAMPLE *)(*(long *)(p_Var1 + 0x10) + lVar3);
    pJVar5 = pJVar5 + 3;
  }
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_pixel_rows(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  gif_source_ptr source = (gif_source_ptr)sinfo;
  register int c;
  register JSAMPROW ptr;
  register JDIMENSION col;
  register JSAMPARRAY colormap = source->colormap;

  ptr = source->pub.buffer[0];
  for (col = cinfo->image_width; col > 0; col--) {
    c = LZWReadByte(source);
    *ptr++ = colormap[CM_RED][c];
    *ptr++ = colormap[CM_GREEN][c];
    *ptr++ = colormap[CM_BLUE][c];
  }
  return 1;
}